

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGBGrayRow_C(uint8_t *src_argb,uint8_t *dst_argb,int width)

{
  uint8_t uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)width;
  if (width < 1) {
    uVar3 = uVar4;
  }
  for (; (int)uVar3 != (int)uVar4; uVar4 = uVar4 + 1) {
    iVar2 = libyuv::RGBToYJ(src_argb[uVar4 * 4 + 2],src_argb[uVar4 * 4 + 1],src_argb[uVar4 * 4]);
    uVar1 = (uint8_t)iVar2;
    dst_argb[uVar4 * 4] = uVar1;
    dst_argb[uVar4 * 4 + 1] = uVar1;
    dst_argb[uVar4 * 4 + 2] = uVar1;
    dst_argb[uVar4 * 4 + 3] = src_argb[uVar4 * 4 + 3];
  }
  return;
}

Assistant:

void ARGBGrayRow_C(const uint8_t* src_argb, uint8_t* dst_argb, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t y = RGBToYJ(src_argb[2], src_argb[1], src_argb[0]);
    dst_argb[2] = dst_argb[1] = dst_argb[0] = y;
    dst_argb[3] = src_argb[3];
    dst_argb += 4;
    src_argb += 4;
  }
}